

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_store.c
# Opt level: O0

void load_store_io(arm7tdmi_t *state,thumbinstr_t *thminstr)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uint uVar4;
  sbyte sVar5;
  ushort *in_RSI;
  undefined8 *in_RDI;
  uint8_t bytevalue;
  uint32_t value_3;
  uint32_t value_2;
  uint32_t value_1;
  uint32_t address;
  uint32_t offset;
  load_store_io_t *instr;
  uint32_t value_4;
  uint32_t value;
  undefined8 in_stack_fffffffffffffed8;
  uint32_t new_pc;
  arm7tdmi_t *in_stack_fffffffffffffee0;
  uint local_b8;
  int local_a8;
  int local_6c;
  uint local_5c;
  int local_4c;
  uint local_40;
  
  sVar5 = 2;
  if (((byte)(*in_RSI >> 0xc) & 1) != 0) {
    sVar5 = 0;
  }
  uVar2 = (uint)(*in_RSI >> 3 & 7);
  if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
    local_a8 = *(int *)((long)in_RDI + (ulong)(uVar2 - 8) * 4 + 0x6c);
  }
  else if (uVar2 < 0xd) {
    local_a8 = *(int *)((long)in_RDI + (ulong)uVar2 * 4 + 0x38);
  }
  else if (uVar2 == 0xd) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_6c = *(int *)((long)in_RDI + 0x84);
      break;
    case 0x12:
      local_6c = *(int *)(in_RDI + 0x12);
      break;
    case 0x13:
      local_6c = *(int *)(in_RDI + 0x11);
      break;
    default:
      local_6c = *(int *)(in_RDI + 0x10);
      break;
    case 0x17:
      local_6c = *(int *)((long)in_RDI + 0x8c);
      break;
    case 0x1b:
      local_6c = *(int *)((long)in_RDI + 0x94);
    }
    local_a8 = local_6c;
  }
  else if (uVar2 == 0xe) {
    switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
    case 0x11:
      local_4c = *(int *)((long)in_RDI + 0x9c);
      break;
    case 0x12:
      local_4c = *(int *)(in_RDI + 0x15);
      break;
    case 0x13:
      local_4c = *(int *)(in_RDI + 0x14);
      break;
    default:
      local_4c = *(int *)(in_RDI + 0x13);
      break;
    case 0x17:
      local_4c = *(int *)((long)in_RDI + 0xa4);
      break;
    case 0x1b:
      local_4c = *(int *)((long)in_RDI + 0xac);
    }
    local_a8 = local_4c;
  }
  else {
    if (uVar2 != 0xf) {
      fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
              "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
              ,0xa4);
      fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
      exit(1);
    }
    local_a8 = *(int *)(in_RDI + 0x16);
  }
  uVar2 = local_a8 + ((uint)(*in_RSI >> 6 & 0x1f) << sVar5);
  if ((*in_RSI >> 0xb & 1) == 0) {
    uVar4 = (uint)(*in_RSI & 7);
    if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
      local_b8 = *(uint *)((long)in_RDI + (ulong)(uVar4 - 8) * 4 + 0x6c);
    }
    else if (uVar4 < 0xd) {
      local_b8 = *(uint *)((long)in_RDI + (ulong)uVar4 * 4 + 0x38);
    }
    else if (uVar4 == 0xd) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_5c = *(uint *)((long)in_RDI + 0x84);
        break;
      case 0x12:
        local_5c = *(uint *)(in_RDI + 0x12);
        break;
      case 0x13:
        local_5c = *(uint *)(in_RDI + 0x11);
        break;
      default:
        local_5c = *(uint *)(in_RDI + 0x10);
        break;
      case 0x17:
        local_5c = *(uint *)((long)in_RDI + 0x8c);
        break;
      case 0x1b:
        local_5c = *(uint *)((long)in_RDI + 0x94);
      }
      local_b8 = local_5c;
    }
    else if (uVar4 == 0xe) {
      switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
      case 0x11:
        local_40 = *(uint *)((long)in_RDI + 0x9c);
        break;
      case 0x12:
        local_40 = *(uint *)(in_RDI + 0x15);
        break;
      case 0x13:
        local_40 = *(uint *)(in_RDI + 0x14);
        break;
      default:
        local_40 = *(uint *)(in_RDI + 0x13);
        break;
      case 0x17:
        local_40 = *(uint *)((long)in_RDI + 0xa4);
        break;
      case 0x1b:
        local_40 = *(uint *)((long)in_RDI + 0xac);
      }
      local_b8 = local_40;
    }
    else {
      if (uVar4 != 0xf) {
        fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                ,0xa4);
        fprintf(_stderr,"Attempted to read unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
        exit(1);
      }
      local_b8 = *(uint *)(in_RDI + 0x16);
    }
    if ((*in_RSI >> 0xc & 1) == 0) {
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Saving 0x%08X to 0x%08X\n",(ulong)local_b8,(ulong)uVar2);
      }
      (*(code *)in_RDI[5])(uVar2,local_b8,2);
    }
    else {
      (*(code *)in_RDI[3])(uVar2,(char)local_b8,2);
    }
  }
  else {
    new_pc = (uint32_t)((ulong)in_stack_fffffffffffffed8 >> 0x20);
    if ((*in_RSI >> 0xc & 1) == 0) {
      uVar3 = (*(code *)in_RDI[2])(uVar2,2);
      uVar3 = arm_ror((status_register_t *)0x0,uVar3,(uVar2 & 3) << 3);
      uVar2 = (uint)(*in_RSI & 7);
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar2,(ulong)uVar3);
      }
      if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar2)) && (uVar2 < 0xd)) {
        *(uint32_t *)((long)in_RDI + (ulong)(uVar2 - 8) * 4 + 0x6c) = uVar3;
      }
      else if (uVar2 < 0xd) {
        *(uint32_t *)((long)in_RDI + (ulong)uVar2 * 4 + 0x38) = uVar3;
      }
      else if (uVar2 == 0xd) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint32_t *)((long)in_RDI + 0x84) = uVar3;
          break;
        case 0x12:
          *(uint32_t *)(in_RDI + 0x12) = uVar3;
          break;
        case 0x13:
          *(uint32_t *)(in_RDI + 0x11) = uVar3;
          break;
        default:
          *(uint32_t *)(in_RDI + 0x10) = uVar3;
          break;
        case 0x17:
          *(uint32_t *)((long)in_RDI + 0x8c) = uVar3;
          break;
        case 0x1b:
          *(uint32_t *)((long)in_RDI + 0x94) = uVar3;
        }
      }
      else if (uVar2 == 0xe) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint32_t *)((long)in_RDI + 0x9c) = uVar3;
          break;
        case 0x12:
          *(uint32_t *)(in_RDI + 0x15) = uVar3;
          break;
        case 0x13:
          *(uint32_t *)(in_RDI + 0x14) = uVar3;
          break;
        default:
          *(uint32_t *)(in_RDI + 0x13) = uVar3;
          break;
        case 0x17:
          *(uint32_t *)((long)in_RDI + 0xa4) = uVar3;
          break;
        case 0x1b:
          *(uint32_t *)((long)in_RDI + 0xac) = uVar3;
        }
      }
      else {
        if (uVar2 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                  ,0xeb);
          fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar2);
          exit(1);
        }
        if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
          set_pc(in_stack_fffffffffffffee0,new_pc);
        }
        else {
          set_pc(in_stack_fffffffffffffee0,new_pc);
        }
      }
    }
    else {
      bVar1 = (*(code *)*in_RDI)(uVar2,2);
      uVar2 = (uint)bVar1;
      uVar4 = (uint)(*in_RSI & 7);
      if (2 < gba_log_verbosity) {
        printf("[DEBUG] Set r%d to 0x%08X\n",(ulong)uVar4,(ulong)uVar2);
      }
      if ((((*(uint *)((long)in_RDI + 0xb4) & 0x1f) == 0x11) && (7 < uVar4)) && (uVar4 < 0xd)) {
        *(uint *)((long)in_RDI + (ulong)(uVar4 - 8) * 4 + 0x6c) = uVar2;
      }
      else if (uVar4 < 0xd) {
        *(uint *)((long)in_RDI + (ulong)uVar4 * 4 + 0x38) = uVar2;
      }
      else if (uVar4 == 0xd) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint *)((long)in_RDI + 0x84) = uVar2;
          break;
        case 0x12:
          *(uint *)(in_RDI + 0x12) = uVar2;
          break;
        case 0x13:
          *(uint *)(in_RDI + 0x11) = uVar2;
          break;
        default:
          *(uint *)(in_RDI + 0x10) = uVar2;
          break;
        case 0x17:
          *(uint *)((long)in_RDI + 0x8c) = uVar2;
          break;
        case 0x1b:
          *(uint *)((long)in_RDI + 0x94) = uVar2;
        }
      }
      else if (uVar4 == 0xe) {
        switch(*(uint *)((long)in_RDI + 0xb4) & 0x1f) {
        case 0x11:
          *(uint *)((long)in_RDI + 0x9c) = uVar2;
          break;
        case 0x12:
          *(uint *)(in_RDI + 0x15) = uVar2;
          break;
        case 0x13:
          *(uint *)(in_RDI + 0x14) = uVar2;
          break;
        default:
          *(uint *)(in_RDI + 0x13) = uVar2;
          break;
        case 0x17:
          *(uint *)((long)in_RDI + 0xa4) = uVar2;
          break;
        case 0x1b:
          *(uint *)((long)in_RDI + 0xac) = uVar2;
        }
      }
      else {
        if (uVar4 != 0xf) {
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/arm7tdmi/thumb_instr/../arm7tdmi.h"
                  ,0xeb);
          fprintf(_stderr,"Attempted to write unknown register: r%d\n\x1b[0;m",(ulong)uVar4);
          exit(1);
        }
        if ((*(uint *)((long)in_RDI + 0xb4) >> 5 & 1) == 0) {
          set_pc(in_stack_fffffffffffffee0,new_pc);
        }
        else {
          set_pc(in_stack_fffffffffffffee0,new_pc);
        }
      }
      (*(code *)in_RDI[6])(1);
    }
  }
  return;
}

Assistant:

void load_store_io(arm7tdmi_t* state, thumbinstr_t * thminstr) {
    load_store_io_t* instr = &thminstr->LOAD_STORE_IO;
    word offset = instr->offset << (instr->b ? 0 : 2);
    word address = get_register(state, instr->rb) + offset;
    if (instr->l) {
        if (instr->b) {
            word value = state->read_byte(address, ACCESS_NONSEQUENTIAL);
            set_register(state, instr->rd, value);
            state->cpu_idle(1);
        } else {
            word value = state->read_word(address, ACCESS_NONSEQUENTIAL);
            value = arm_ror(NULL, value, (address & 3u) << 3);
            set_register(state, instr->rd, value);
        }
    } else {
        word value = get_register(state, instr->rd);
        if (instr->b) {
            byte bytevalue = value & 0xFF;
            state->write_byte(address, bytevalue, ACCESS_NONSEQUENTIAL);
        } else {
            logdebug("Saving 0x%08X to 0x%08X", value, address);
            state->write_word(address, value, ACCESS_NONSEQUENTIAL);
        }
    }
}